

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

string * __thiscall
wabt::(anonymous_namespace)::CWriter::DefineLocalScopeName_abi_cxx11_
          (string *__return_storage_ptr__,CWriter *this,string_view name,bool is_label)

{
  SymbolSet *set;
  long *plVar1;
  string *extraout_RAX;
  string *psVar2;
  long *plVar3;
  byte bVar4;
  long *plVar5;
  char *pcVar6;
  string *unique;
  string_view sVar7;
  string_view name_00;
  string_view proposed_name;
  string_view wasm_name;
  long local_60;
  long lStack_58;
  string local_50;
  
  psVar2 = (string *)name._M_str;
  sVar7._M_str = (anon_unknown_0 *)name._M_len;
  bVar4 = is_label | 0x6c;
  sVar7._M_len = (size_t)psVar2;
  sVar7 = anon_unknown_0::StripLeadingDollar(sVar7._M_str,sVar7);
  name_00._M_len = sVar7._M_str;
  name_00._M_str = (char *)0x0;
  Mangle_abi_cxx11_(&local_50,(CWriter *)sVar7._M_len,name_00,is_label);
  pcVar6 = (char *)0x4;
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x163810);
  plVar5 = plVar1 + 2;
  if ((long *)*plVar1 == plVar5) {
    local_60 = *plVar5;
    lStack_58 = plVar1[3];
    plVar3 = &local_60;
  }
  else {
    local_60 = *plVar5;
    plVar3 = (long *)*plVar1;
  }
  set = (SymbolSet *)plVar1[1];
  *plVar1 = (long)plVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  proposed_name._M_str = pcVar6;
  proposed_name._M_len = (size_t)plVar3;
  anon_unknown_0::CWriter::FindUniqueName
            (__return_storage_ptr__,(CWriter *)(this + 0x150),set,proposed_name);
  wasm_name._M_str = (char *)__return_storage_ptr__;
  wasm_name._M_len = (size_t)psVar2;
  anon_unknown_0::CWriter::ClaimName
            ((CWriter *)(this + 0x150),(SymbolSet *)(this + 0x90),(SymbolMap *)(ulong)bVar4,
             (char)name._M_len,wasm_name,psVar2);
  if (plVar3 != &local_60) {
    operator_delete(plVar3,local_60 + 1);
  }
  psVar2 = (string *)&local_50.field_2;
  if ((string *)local_50._M_dataplus._M_p != psVar2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    psVar2 = extraout_RAX;
  }
  return psVar2;
}

Assistant:

std::string CWriter::DefineLocalScopeName(std::string_view name,
                                          bool is_label) {
  return ClaimUniqueName(local_syms_, local_sym_map_,
                         is_label ? kLabelSuffix : kParamSuffix, name,
                         kSymbolPrefix + MangleName(StripLeadingDollar(name)));
}